

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCoVec(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i)

{
  uint *puVar1;
  uint *puVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int iVar9;
  
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = (int)((ulong)((long)(pSVar3->coWeights).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar4) >> 3) *
          -0x49249249;
  *(undefined8 *)((long)&pnVar4[i].m_backend.data + 0x20) =
       *(undefined8 *)((long)&pnVar4[iVar9].m_backend.data + 0x20);
  uVar5 = *(undefined8 *)&pnVar4[iVar9].m_backend.data;
  uVar6 = *(undefined8 *)((long)&pnVar4[iVar9].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[iVar9].m_backend.data + 0x10);
  uVar7 = *(undefined8 *)(puVar1 + 2);
  puVar2 = (uint *)((long)&pnVar4[i].m_backend.data + 0x10);
  *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(puVar2 + 2) = uVar7;
  *(undefined8 *)&pnVar4[i].m_backend.data = uVar5;
  *(undefined8 *)((long)&pnVar4[i].m_backend.data + 8) = uVar6;
  pnVar4[i].m_backend.exp = pnVar4[iVar9].m_backend.exp;
  pnVar4[i].m_backend.neg = pnVar4[iVar9].m_backend.neg;
  iVar8 = pnVar4[iVar9].m_backend.prec_elem;
  pnVar4[i].m_backend.fpclass = pnVar4[iVar9].m_backend.fpclass;
  pnVar4[i].m_backend.prec_elem = iVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&pSVar3->coWeights,
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->thecovectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedCoVec(int i)
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& coWeights = this->thesolver->coWeights;
   coWeights[i] = coWeights[coWeights.dim()];
   coWeights.reDim(this->thesolver->dim());
}